

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void update_rhythm_mode(EOPLL *opll)

{
  byte bVar1;
  uint uVar2;
  uint8_t new_rhythm_mode;
  EOPLL *opll_local;
  
  uVar2 = (int)(uint)opll->reg[0xe] >> 5;
  bVar1 = (byte)uVar2 & 1;
  if (opll->rhythm_mode != bVar1) {
    if ((uVar2 & 1) == 0) {
      opll->slot[0xe].type = '\0';
      opll->slot[0xe].pg_keep = '\0';
      opll->slot[0xf].type = '\x01';
      opll->slot[0x10].type = '\0';
      opll->slot[0x11].type = '\x01';
      opll->slot[0x11].pg_keep = '\0';
      set_patch(opll,6,(int)(uint)opll->reg[0x36] >> 4);
      set_patch(opll,7,(int)(uint)opll->reg[0x37] >> 4);
      set_patch(opll,8,(int)(uint)opll->reg[0x38] >> 4);
    }
    else {
      opll->slot[0xe].type = '\x03';
      opll->slot[0xe].pg_keep = '\x01';
      opll->slot[0xf].type = '\x03';
      opll->slot[0x10].type = '\x03';
      opll->slot[0x11].type = '\x03';
      opll->slot[0x11].pg_keep = '\x01';
      set_patch(opll,6,0x10);
      set_patch(opll,7,0x11);
      set_patch(opll,8,0x12);
      set_slot_volume(opll->slot + 0xe,((int)(uint)opll->reg[0x37] >> 4) << 2);
      set_slot_volume(opll->slot + 0x10,((int)(uint)opll->reg[0x38] >> 4) << 2);
    }
  }
  opll->rhythm_mode = bVar1;
  return;
}

Assistant:

static INLINE void update_rhythm_mode(EOPLL *opll) {
  const uint8_t new_rhythm_mode = (opll->reg[0x0e] >> 5) & 1;

  if (opll->rhythm_mode != new_rhythm_mode) {

    if (new_rhythm_mode) {
      opll->slot[SLOT_HH].type = 3;
      opll->slot[SLOT_HH].pg_keep = 1;
      opll->slot[SLOT_SD].type = 3;
      opll->slot[SLOT_TOM].type = 3;
      opll->slot[SLOT_CYM].type = 3;
      opll->slot[SLOT_CYM].pg_keep = 1;
      set_patch(opll, 6, 16);
      set_patch(opll, 7, 17);
      set_patch(opll, 8, 18);
      set_slot_volume(&opll->slot[SLOT_HH], ((opll->reg[0x37] >> 4) & 15) << 2);
      set_slot_volume(&opll->slot[SLOT_TOM], ((opll->reg[0x38] >> 4) & 15) << 2);
    } else {
      opll->slot[SLOT_HH].type = 0;
      opll->slot[SLOT_HH].pg_keep = 0;
      opll->slot[SLOT_SD].type = 1;
      opll->slot[SLOT_TOM].type = 0;
      opll->slot[SLOT_CYM].type = 1;
      opll->slot[SLOT_CYM].pg_keep = 0;
      set_patch(opll, 6, opll->reg[0x36] >> 4);
      set_patch(opll, 7, opll->reg[0x37] >> 4);
      set_patch(opll, 8, opll->reg[0x38] >> 4);
    }
  }

  opll->rhythm_mode = new_rhythm_mode;
}